

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void __thiscall
embree::sse42::
BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceArrayIntersectorKMB<4>_>,_false>
::intersect(BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceArrayIntersectorKMB<4>_>,_false>
            *this,vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  RayQueryContext *pRVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  uint uVar13;
  size_t bits;
  ulong uVar14;
  ulong extraout_RAX;
  undefined4 uVar15;
  NodeRef *pNVar16;
  long lVar17;
  AABBNodeMB4D *node1;
  ulong uVar18;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar19;
  RayQueryContext *pRVar20;
  bool bVar21;
  float fVar22;
  float fVar31;
  float fVar32;
  vint4 ai;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar33;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar36;
  undefined1 auVar34 [16];
  float fVar37;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar35;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar43;
  float fVar44;
  vfloat_impl<4> __tmp_1;
  float fVar45;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar41;
  undefined1 auVar42 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  vint4 ai_1;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar56;
  float fVar57;
  vint4 ai_3;
  undefined1 auVar55 [16];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  vint4 bi;
  float fVar62;
  float fVar63;
  float fVar65;
  float fVar66;
  vint4 bi_3;
  undefined1 auVar64 [16];
  float fVar67;
  float fVar68;
  float fVar71;
  float fVar72;
  float fVar73;
  vint4 bi_1;
  float fVar74;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar75;
  uint uVar76;
  uint uVar77;
  float fVar78;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  vint4 ai_2;
  float fVar83;
  uint uVar84;
  uint uVar85;
  uint uVar86;
  uint uVar88;
  uint uVar89;
  vint4 bi_2;
  undefined1 auVar87 [16];
  uint uVar90;
  float fVar92;
  undefined1 auVar91 [16];
  float fVar93;
  float fVar94;
  float fVar96;
  float fVar97;
  undefined1 in_XMM12 [16];
  undefined1 auVar95 [16];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 in_XMM13 [16];
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 in_XMM14 [16];
  float fVar106;
  Precalculations pre;
  undefined1 local_1788 [8];
  float fStack_1780;
  float fStack_177c;
  vbool<4> valid_leaf;
  undefined1 local_1758 [16];
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16f8;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  lVar17 = (valid_i->field_0).v[0];
  pRVar20 = *(RayQueryContext **)(lVar17 + 0x70);
  if (pRVar20 != (RayQueryContext *)0x8) {
    auVar29._8_4_ = 0xffffffff;
    auVar29._0_8_ = 0xffffffffffffffff;
    auVar29._12_4_ = 0xffffffff;
    auVar70._0_4_ = -(uint)(*(int *)this == -1);
    auVar70._4_4_ = -(uint)(*(int *)(this + 4) == -1);
    auVar70._8_4_ = -(uint)(*(int *)(this + 8) == -1);
    auVar70._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
    iVar12 = movmskps((int)lVar17,auVar70);
    uVar14 = CONCAT44((int)((ulong)lVar17 >> 0x20),iVar12);
    if (iVar12 != 0) {
      auVar28._0_8_ = (This->intersector4).intersect;
      auVar28._8_8_ = (This->intersector4).occluded;
      fVar71 = (float)((ulong)auVar28._0_8_ >> 0x20);
      fVar74 = (float)((ulong)auVar28._8_8_ >> 0x20);
      fVar46 = (float)DAT_01f80d30;
      fVar48 = DAT_01f80d30._4_4_;
      fVar50 = DAT_01f80d30._8_4_;
      fVar52 = DAT_01f80d30._12_4_;
      auVar55._4_4_ = -(uint)(ABS(fVar71) < fVar48);
      auVar55._0_4_ = -(uint)(ABS((float)auVar28._0_8_) < fVar46);
      auVar55._8_4_ = -(uint)(ABS((float)auVar28._8_8_) < fVar50);
      auVar55._12_4_ = -(uint)(ABS(fVar74) < fVar52);
      auVar55 = blendvps(auVar28,_DAT_01f80d30,auVar55);
      auVar3 = *(undefined1 (*) [16])&(This->intersector4).name;
      auVar87._4_4_ = -(uint)(ABS(auVar3._4_4_) < fVar48);
      auVar87._0_4_ = -(uint)(ABS(auVar3._0_4_) < fVar46);
      auVar87._8_4_ = -(uint)(ABS(auVar3._8_4_) < fVar50);
      auVar87._12_4_ = -(uint)(ABS(auVar3._12_4_) < fVar52);
      auVar87 = blendvps(auVar3,_DAT_01f80d30,auVar87);
      auVar4._0_8_ = (This->intersector4_filter).occluded;
      auVar4._8_8_ = (This->intersector4_filter).name;
      fVar78 = (float)((ulong)auVar4._0_8_ >> 0x20);
      fVar83 = (float)((ulong)auVar4._8_8_ >> 0x20);
      auVar91._4_4_ = -(uint)(ABS(fVar78) < fVar48);
      auVar91._0_4_ = -(uint)(ABS((float)auVar4._0_8_) < fVar46);
      auVar91._8_4_ = -(uint)(ABS((float)auVar4._8_8_) < fVar50);
      auVar91._12_4_ = -(uint)(ABS(fVar83) < fVar52);
      auVar91 = blendvps(auVar4,_DAT_01f80d30,auVar91);
      auVar95 = rcpps(in_XMM12,auVar55);
      fVar94 = auVar95._0_4_;
      fVar96 = auVar95._4_4_;
      fVar97 = auVar95._8_4_;
      fVar98 = auVar95._12_4_;
      auVar95 = rcpps(in_XMM13,auVar87);
      fVar99 = auVar95._0_4_;
      fVar100 = auVar95._4_4_;
      fVar101 = auVar95._8_4_;
      fVar102 = auVar95._12_4_;
      auVar95 = rcpps(in_XMM14,auVar91);
      fVar103 = auVar95._0_4_;
      fVar104 = auVar95._4_4_;
      fVar105 = auVar95._8_4_;
      fVar106 = auVar95._12_4_;
      auVar69._0_8_ =
           CONCAT44(-(uint)(fVar71 < 0.0),-(uint)((float)auVar28._0_8_ < 0.0)) & 0x100000001;
      auVar69._8_4_ = -(uint)((float)auVar28._8_8_ < 0.0) & 1;
      auVar69._12_4_ = -(uint)(fVar74 < 0.0) & 1;
      auVar64._0_8_ =
           CONCAT44(-(uint)(auVar3._4_4_ < 0.0),-(uint)(auVar3._0_4_ < 0.0)) & 0x200000002;
      auVar64._8_4_ = -(uint)(auVar3._8_4_ < 0.0) & 2;
      auVar64._12_4_ = -(uint)(auVar3._12_4_ < 0.0) & 2;
      fVar71 = *(float *)&This->ptr;
      fVar74 = *(float *)((long)&This->ptr + 4);
      fVar92 = *(float *)&This->leafIntersector;
      fVar93 = *(float *)((long)&This->leafIntersector + 4);
      fVar46 = *(float *)&(This->collider).collide;
      fVar48 = *(float *)((long)&(This->collider).collide + 4);
      fVar50 = *(float *)&(This->collider).name;
      fVar52 = *(float *)((long)&(This->collider).name + 4);
      local_16e8 = (This->intersector1).intersect;
      uStack_16e0 = (This->intersector1).occluded;
      auVar95._8_4_ = -(uint)((float)auVar4._8_8_ < 0.0) & 4;
      auVar95._0_8_ =
           CONCAT44(-(uint)(fVar78 < 0.0),-(uint)((float)auVar4._0_8_ < 0.0)) & 0x400000004;
      auVar95._12_4_ = -(uint)(fVar83 < 0.0) & 4;
      auVar3._0_8_ = (This->intersector1).pointQuery;
      auVar3._8_8_ = (This->intersector1).name;
      local_1758 = auVar70 ^ auVar29 | auVar95 | auVar64 | auVar69;
      do {
        lVar17 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
          }
        }
        iVar12 = *(int *)(local_1758 + lVar17 * 4);
        auVar23._0_4_ = -(uint)(iVar12 == local_1758._0_4_);
        auVar23._4_4_ = -(uint)(iVar12 == local_1758._4_4_);
        auVar23._8_4_ = -(uint)(iVar12 == local_1758._8_4_);
        auVar23._12_4_ = -(uint)(iVar12 == local_1758._12_4_);
        uVar15 = movmskps((int)lVar17,auVar23);
        uVar14 = uVar14 & ~CONCAT44((int)((ulong)lVar17 >> 0x20),uVar15);
      } while (uVar14 != 0);
      auVar34._0_4_ = -(uint)(*(int *)this == -1);
      auVar34._4_4_ = -(uint)(*(int *)(this + 4) == -1);
      auVar34._8_4_ = -(uint)(*(int *)(this + 8) == -1);
      auVar34._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
      auVar70 = maxps(auVar3,(undefined1  [16])0x0);
      local_16f8.v = (__m128)blendvps(_DAT_01f7a9f0,auVar70,auVar34);
      local_1758._8_4_ = 0xffffffff;
      local_1758._0_8_ = 0xffffffffffffffff;
      local_1758._12_4_ = 0xffffffff;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_node[1].ptr = (size_t)pRVar20;
      stack_near[1].field_0 = local_16f8;
      if (pRVar20 != (RayQueryContext *)&DAT_fffffffffffffff8) {
        fVar94 = fVar94 + (1.0 - auVar55._0_4_ * fVar94) * fVar94;
        fVar96 = fVar96 + (1.0 - auVar55._4_4_ * fVar96) * fVar96;
        fVar97 = fVar97 + (1.0 - auVar55._8_4_ * fVar97) * fVar97;
        fVar98 = fVar98 + (1.0 - auVar55._12_4_ * fVar98) * fVar98;
        fVar99 = fVar99 + (1.0 - auVar87._0_4_ * fVar99) * fVar99;
        fVar100 = fVar100 + (1.0 - auVar87._4_4_ * fVar100) * fVar100;
        fVar101 = fVar101 + (1.0 - auVar87._8_4_ * fVar101) * fVar101;
        fVar102 = fVar102 + (1.0 - auVar87._12_4_ * fVar102) * fVar102;
        fVar103 = fVar103 + (1.0 - auVar91._0_4_ * fVar103) * fVar103;
        fVar104 = fVar104 + (1.0 - auVar91._4_4_ * fVar104) * fVar104;
        fVar105 = fVar105 + (1.0 - auVar91._8_4_ * fVar105) * fVar105;
        fVar106 = fVar106 + (1.0 - auVar91._12_4_ * fVar106) * fVar106;
        pNVar16 = stack_node + 1;
        auVar70 = maxps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,
                        (undefined1  [16])0x0);
        _local_1788 = blendvps(_DAT_01f7aa00,auVar70,auVar34);
        paVar19 = &stack_near[2].field_0;
        local_1708 = fVar94;
        fStack_1704 = fVar96;
        fStack_1700 = fVar97;
        fStack_16fc = fVar98;
        local_1718 = fVar99;
        fStack_1714 = fVar100;
        fStack_1710 = fVar101;
        fStack_170c = fVar102;
        local_1728 = fVar103;
        fStack_1724 = fVar104;
        fStack_1720 = fVar105;
        fStack_171c = fVar106;
        local_1738 = fVar71;
        fStack_1734 = fVar74;
        fStack_1730 = fVar92;
        fStack_172c = fVar93;
        local_1748 = fVar46;
        fStack_1744 = fVar48;
        fStack_1740 = fVar50;
        fStack_173c = fVar52;
        uVar14 = 0;
        do {
          aVar41 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar19[-1].v;
          paVar19 = paVar19 + -1;
          auVar24._4_4_ = -(uint)(aVar41.v[1] < (float)local_1788._4_4_);
          auVar24._0_4_ = -(uint)(aVar41.v[0] < (float)local_1788._0_4_);
          auVar24._8_4_ = -(uint)(aVar41.v[2] < fStack_1780);
          auVar24._12_4_ = -(uint)(aVar41._12_4_ < fStack_177c);
          uVar13 = movmskps((int)uVar14,auVar24);
          uVar14 = (ulong)uVar13;
          if (uVar13 != 0) {
            while( true ) {
              fVar78 = aVar41.v[0];
              fVar83 = aVar41.v[1];
              fVar36 = aVar41.v[2];
              fVar37 = aVar41.v[3];
              if (((ulong)pRVar20 & 8) != 0) break;
              uVar18 = (ulong)pRVar20 & 0xfffffffffffffff0;
              uVar13 = (uint)pRVar20 & 7;
              uVar14 = 0;
              lVar17 = -0x10;
              pRVar20 = (RayQueryContext *)0x8;
              aVar35 = _DAT_01f7a9f0;
              do {
                pRVar6 = *(RayQueryContext **)(uVar18 + 0x20 + lVar17 * 2);
                aVar41 = aVar35;
                if (pRVar6 == (RayQueryContext *)0x8) break;
                fVar33 = *(float *)(uVar18 + 0x90 + lVar17);
                fVar47 = *(float *)(uVar18 + 0x30 + lVar17);
                fVar62 = *(float *)(uVar18 + 0x40 + lVar17);
                fVar53 = *(float *)(uVar18 + 0x50 + lVar17);
                fVar63 = *(float *)(uVar18 + 0x60 + lVar17);
                uVar2 = (This->intersector4_nofilter).intersect;
                uVar5 = (This->intersector4_nofilter).occluded;
                fVar40 = (float)uVar2;
                fVar43 = (float)((ulong)uVar2 >> 0x20);
                fVar44 = (float)uVar5;
                fVar45 = (float)((ulong)uVar5 >> 0x20);
                fVar54 = *(float *)(uVar18 + 0xb0 + lVar17);
                fVar58 = *(float *)(uVar18 + 0xd0 + lVar17);
                fVar59 = *(float *)(uVar18 + 0x70 + lVar17);
                fVar65 = *(float *)(uVar18 + 0xa0 + lVar17);
                fVar66 = *(float *)(uVar18 + 0xc0 + lVar17);
                fVar67 = *(float *)(uVar18 + 0xe0 + lVar17);
                fVar1 = *(float *)(uVar18 + 0x80 + lVar17);
                fVar22 = ((fVar33 * fVar40 + fVar47) - fVar71) * fVar94;
                fVar31 = ((fVar33 * fVar43 + fVar47) - fVar74) * fVar96;
                fVar32 = ((fVar33 * fVar44 + fVar47) - fVar92) * fVar97;
                fVar33 = ((fVar33 * fVar45 + fVar47) - fVar93) * fVar98;
                fVar47 = ((fVar54 * fVar40 + fVar53) - fVar46) * fVar99;
                fVar49 = ((fVar54 * fVar43 + fVar53) - fVar48) * fVar100;
                fVar51 = ((fVar54 * fVar44 + fVar53) - fVar50) * fVar101;
                fVar53 = ((fVar54 * fVar45 + fVar53) - fVar52) * fVar102;
                fVar54 = ((fVar58 * fVar40 + fVar59) - (float)local_16e8) * fVar103;
                fVar56 = ((fVar58 * fVar43 + fVar59) - local_16e8._4_4_) * fVar104;
                fVar57 = ((fVar58 * fVar44 + fVar59) - (float)uStack_16e0) * fVar105;
                fVar58 = ((fVar58 * fVar45 + fVar59) - uStack_16e0._4_4_) * fVar106;
                fVar59 = ((fVar65 * fVar40 + fVar62) - fVar71) * fVar94;
                fVar60 = ((fVar65 * fVar43 + fVar62) - fVar74) * fVar96;
                fVar61 = ((fVar65 * fVar44 + fVar62) - fVar92) * fVar97;
                fVar62 = ((fVar65 * fVar45 + fVar62) - fVar93) * fVar98;
                fVar68 = ((fVar66 * fVar40 + fVar63) - fVar46) * fVar99;
                fVar72 = ((fVar66 * fVar43 + fVar63) - fVar48) * fVar100;
                fVar73 = ((fVar66 * fVar44 + fVar63) - fVar50) * fVar101;
                fVar75 = ((fVar66 * fVar45 + fVar63) - fVar52) * fVar102;
                fVar63 = ((fVar67 * fVar40 + fVar1) - (float)local_16e8) * fVar103;
                fVar65 = ((fVar67 * fVar43 + fVar1) - local_16e8._4_4_) * fVar104;
                fVar66 = ((fVar67 * fVar44 + fVar1) - (float)uStack_16e0) * fVar105;
                fVar67 = ((fVar67 * fVar45 + fVar1) - uStack_16e0._4_4_) * fVar106;
                uVar76 = (uint)((int)fVar59 < (int)fVar22) * (int)fVar59 |
                         (uint)((int)fVar59 >= (int)fVar22) * (int)fVar22;
                uVar79 = (uint)((int)fVar60 < (int)fVar31) * (int)fVar60 |
                         (uint)((int)fVar60 >= (int)fVar31) * (int)fVar31;
                uVar81 = (uint)((int)fVar61 < (int)fVar32) * (int)fVar61 |
                         (uint)((int)fVar61 >= (int)fVar32) * (int)fVar32;
                uVar84 = (uint)((int)fVar62 < (int)fVar33) * (int)fVar62 |
                         (uint)((int)fVar62 >= (int)fVar33) * (int)fVar33;
                uVar86 = (uint)((int)fVar68 < (int)fVar47) * (int)fVar68 |
                         (uint)((int)fVar68 >= (int)fVar47) * (int)fVar47;
                uVar88 = (uint)((int)fVar72 < (int)fVar49) * (int)fVar72 |
                         (uint)((int)fVar72 >= (int)fVar49) * (int)fVar49;
                uVar89 = (uint)((int)fVar73 < (int)fVar51) * (int)fVar73 |
                         (uint)((int)fVar73 >= (int)fVar51) * (int)fVar51;
                uVar90 = (uint)((int)fVar75 < (int)fVar53) * (int)fVar75 |
                         (uint)((int)fVar75 >= (int)fVar53) * (int)fVar53;
                uVar86 = ((int)uVar86 < (int)uVar76) * uVar76 |
                         ((int)uVar86 >= (int)uVar76) * uVar86;
                uVar88 = ((int)uVar88 < (int)uVar79) * uVar79 |
                         ((int)uVar88 >= (int)uVar79) * uVar88;
                uVar89 = ((int)uVar89 < (int)uVar81) * uVar81 |
                         ((int)uVar89 >= (int)uVar81) * uVar89;
                uVar90 = ((int)uVar90 < (int)uVar84) * uVar84 |
                         ((int)uVar90 >= (int)uVar84) * uVar90;
                uVar76 = (uint)((int)fVar63 < (int)fVar54) * (int)fVar63 |
                         (uint)((int)fVar63 >= (int)fVar54) * (int)fVar54;
                uVar79 = (uint)((int)fVar65 < (int)fVar56) * (int)fVar65 |
                         (uint)((int)fVar65 >= (int)fVar56) * (int)fVar56;
                uVar81 = (uint)((int)fVar66 < (int)fVar57) * (int)fVar66 |
                         (uint)((int)fVar66 >= (int)fVar57) * (int)fVar57;
                uVar84 = (uint)((int)fVar67 < (int)fVar58) * (int)fVar67 |
                         (uint)((int)fVar67 >= (int)fVar58) * (int)fVar58;
                uVar77 = ((int)uVar76 < (int)uVar86) * uVar86 |
                         ((int)uVar76 >= (int)uVar86) * uVar76;
                uVar80 = ((int)uVar79 < (int)uVar88) * uVar88 |
                         ((int)uVar79 >= (int)uVar88) * uVar79;
                uVar82 = ((int)uVar81 < (int)uVar89) * uVar89 |
                         ((int)uVar81 >= (int)uVar89) * uVar81;
                uVar85 = ((int)uVar84 < (int)uVar90) * uVar90 |
                         ((int)uVar84 >= (int)uVar90) * uVar84;
                uVar76 = (uint)((int)fVar59 < (int)fVar22) * (int)fVar22 |
                         (uint)((int)fVar59 >= (int)fVar22) * (int)fVar59;
                uVar79 = (uint)((int)fVar60 < (int)fVar31) * (int)fVar31 |
                         (uint)((int)fVar60 >= (int)fVar31) * (int)fVar60;
                uVar81 = (uint)((int)fVar61 < (int)fVar32) * (int)fVar32 |
                         (uint)((int)fVar61 >= (int)fVar32) * (int)fVar61;
                uVar84 = (uint)((int)fVar62 < (int)fVar33) * (int)fVar33 |
                         (uint)((int)fVar62 >= (int)fVar33) * (int)fVar62;
                uVar86 = (uint)((int)fVar68 < (int)fVar47) * (int)fVar47 |
                         (uint)((int)fVar68 >= (int)fVar47) * (int)fVar68;
                uVar88 = (uint)((int)fVar72 < (int)fVar49) * (int)fVar49 |
                         (uint)((int)fVar72 >= (int)fVar49) * (int)fVar72;
                uVar89 = (uint)((int)fVar73 < (int)fVar51) * (int)fVar51 |
                         (uint)((int)fVar73 >= (int)fVar51) * (int)fVar73;
                uVar90 = (uint)((int)fVar75 < (int)fVar53) * (int)fVar53 |
                         (uint)((int)fVar75 >= (int)fVar53) * (int)fVar75;
                uVar86 = ((int)uVar76 < (int)uVar86) * uVar76 |
                         ((int)uVar76 >= (int)uVar86) * uVar86;
                uVar88 = ((int)uVar79 < (int)uVar88) * uVar79 |
                         ((int)uVar79 >= (int)uVar88) * uVar88;
                uVar89 = ((int)uVar81 < (int)uVar89) * uVar81 |
                         ((int)uVar81 >= (int)uVar89) * uVar89;
                uVar90 = ((int)uVar84 < (int)uVar90) * uVar84 |
                         ((int)uVar84 >= (int)uVar90) * uVar90;
                uVar76 = (uint)((int)fVar63 < (int)fVar54) * (int)fVar54 |
                         (uint)((int)fVar63 >= (int)fVar54) * (int)fVar63;
                uVar79 = (uint)((int)fVar65 < (int)fVar56) * (int)fVar56 |
                         (uint)((int)fVar65 >= (int)fVar56) * (int)fVar65;
                uVar81 = (uint)((int)fVar66 < (int)fVar57) * (int)fVar57 |
                         (uint)((int)fVar66 >= (int)fVar57) * (int)fVar66;
                uVar84 = (uint)((int)fVar67 < (int)fVar58) * (int)fVar58 |
                         (uint)((int)fVar67 >= (int)fVar58) * (int)fVar67;
                uVar76 = (uint)((int)local_1788._0_4_ < (int)uVar76) * local_1788._0_4_ |
                         ((int)local_1788._0_4_ >= (int)uVar76) * uVar76;
                uVar79 = (uint)((int)local_1788._4_4_ < (int)uVar79) * local_1788._4_4_ |
                         ((int)local_1788._4_4_ >= (int)uVar79) * uVar79;
                uVar81 = (uint)((int)fStack_1780 < (int)uVar81) * (int)fStack_1780 |
                         ((int)fStack_1780 >= (int)uVar81) * uVar81;
                uVar84 = (uint)((int)fStack_177c < (int)uVar84) * (int)fStack_177c |
                         ((int)fStack_177c >= (int)uVar84) * uVar84;
                bVar21 = (float)((uint)((int)uVar77 < (int)local_16f8._0_4_) * local_16f8._0_4_ |
                                ((int)uVar77 >= (int)local_16f8._0_4_) * uVar77) <=
                         (float)(((int)uVar86 < (int)uVar76) * uVar86 |
                                ((int)uVar86 >= (int)uVar76) * uVar76);
                bVar7 = (float)((uint)((int)uVar80 < (int)local_16f8._4_4_) * local_16f8._4_4_ |
                               ((int)uVar80 >= (int)local_16f8._4_4_) * uVar80) <=
                        (float)(((int)uVar88 < (int)uVar79) * uVar88 |
                               ((int)uVar88 >= (int)uVar79) * uVar79);
                bVar8 = (float)((uint)((int)uVar82 < (int)local_16f8._8_4_) * local_16f8._8_4_ |
                               ((int)uVar82 >= (int)local_16f8._8_4_) * uVar82) <=
                        (float)(((int)uVar89 < (int)uVar81) * uVar89 |
                               ((int)uVar89 >= (int)uVar81) * uVar81);
                bVar9 = (float)((uint)((int)uVar85 < (int)local_16f8._12_4_) * local_16f8._12_4_ |
                               ((int)uVar85 >= (int)local_16f8._12_4_) * uVar85) <=
                        (float)(((int)uVar90 < (int)uVar84) * uVar90 |
                               ((int)uVar90 >= (int)uVar84) * uVar84);
                if (uVar13 == 6) {
                  fVar33 = *(float *)(uVar18 + 0xf0 + lVar17);
                  fVar47 = *(float *)(uVar18 + 0x100 + lVar17);
                  bVar21 = (fVar33 <= fVar40 && fVar40 < fVar47) && bVar21;
                  bVar7 = (fVar33 <= fVar43 && fVar43 < fVar47) && bVar7;
                  bVar8 = (fVar33 <= fVar44 && fVar44 < fVar47) && bVar8;
                  bVar9 = (fVar33 <= fVar45 && fVar45 < fVar47) && bVar9;
                }
                auVar25._0_4_ = (-(uint)bVar21 & -(uint)(fVar78 < (float)local_1788._0_4_)) << 0x1f;
                auVar25._4_4_ = (-(uint)bVar7 & -(uint)(fVar83 < (float)local_1788._4_4_)) << 0x1f;
                auVar25._8_4_ = (-(uint)bVar8 & -(uint)(fVar36 < fStack_1780)) << 0x1f;
                auVar25._12_4_ = (-(uint)bVar9 & -(uint)(fVar37 < fStack_177c)) << 0x1f;
                uVar76 = movmskps((int)context,auVar25);
                context = (RayQueryContext *)(ulong)uVar76;
                if (uVar76 != 0) {
                  auVar11._4_4_ = uVar80;
                  auVar11._0_4_ = uVar77;
                  auVar11._8_4_ = uVar82;
                  auVar11._12_4_ = uVar85;
                  aVar41.v = (__m128)blendvps(_DAT_01f7a9f0,auVar11,auVar25);
                  auVar26._4_4_ = -(uint)(aVar41.v[1] < aVar35.v[1]);
                  auVar26._0_4_ = -(uint)(aVar41.v[0] < aVar35.v[0]);
                  auVar26._8_4_ = -(uint)(aVar41.v[2] < aVar35.v[2]);
                  auVar26._12_4_ = -(uint)(aVar41.v[3] < aVar35.v[3]);
                  iVar12 = movmskps(uVar76,auVar26);
                  context = pRVar6;
                  aVar27 = aVar41;
                  if ((iVar12 == 0) ||
                     (bVar21 = pRVar20 != (RayQueryContext *)0x8, context = pRVar20,
                     pRVar20 = pRVar6, aVar27 = aVar35, aVar35 = aVar41, bVar21)) {
                    aVar41 = aVar35;
                    uVar14 = uVar14 + 1;
                    pNVar16->ptr = (size_t)context;
                    pNVar16 = pNVar16 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar19->v = aVar27;
                    paVar19 = paVar19 + 1;
                  }
                }
                lVar17 = lVar17 + 4;
                aVar35 = aVar41;
              } while (lVar17 != 0);
              if (pRVar20 == (RayQueryContext *)0x8) goto LAB_00244635;
              if (1 < uVar14) {
                auVar70 = *(undefined1 (*) [16])paVar19[-2].v;
                auVar29 = *(undefined1 (*) [16])paVar19[-1].v;
                auVar38._4_4_ = -(uint)(auVar70._4_4_ < auVar29._4_4_);
                auVar38._0_4_ = -(uint)(auVar70._0_4_ < auVar29._0_4_);
                auVar38._8_4_ = -(uint)(auVar70._8_4_ < auVar29._8_4_);
                auVar38._12_4_ = -(uint)(auVar70._12_4_ < auVar29._12_4_);
                iVar12 = movmskps(uVar13,auVar38);
                auVar28 = auVar29;
                if (iVar12 != 0) {
                  *(undefined1 (*) [16])paVar19[-2].v = auVar29;
                  *(undefined1 (*) [16])paVar19[-1].v = auVar70;
                  auVar28 = *(undefined1 (*) [16])(pNVar16 + -2);
                  auVar39._0_8_ = auVar28._8_8_;
                  auVar39._8_4_ = auVar28._0_4_;
                  auVar39._12_4_ = auVar28._4_4_;
                  *(undefined1 (*) [16])(pNVar16 + -2) = auVar39;
                  auVar28 = auVar70;
                  auVar70 = auVar29;
                }
                if (uVar14 != 2) {
                  auVar29 = *(undefined1 (*) [16])paVar19[-3].v;
                  auVar10._4_4_ = -(uint)(auVar29._4_4_ < auVar28._4_4_);
                  auVar10._0_4_ = -(uint)(auVar29._0_4_ < auVar28._0_4_);
                  auVar10._8_4_ = -(uint)(auVar29._8_4_ < auVar28._8_4_);
                  auVar10._12_4_ = -(uint)(auVar29._12_4_ < auVar28._12_4_);
                  uVar13 = movmskps((int)uVar14,auVar10);
                  uVar14 = (ulong)uVar13;
                  if (uVar13 != 0) {
                    *(undefined1 (*) [16])paVar19[-3].v = auVar28;
                    *(undefined1 (*) [16])paVar19[-1].v = auVar29;
                    uVar14 = pNVar16[-3].ptr;
                    pNVar16[-3].ptr = pNVar16[-1].ptr;
                    pNVar16[-1].ptr = uVar14;
                    auVar29 = auVar28;
                  }
                  auVar42._4_4_ = -(uint)(auVar29._4_4_ < auVar70._4_4_);
                  auVar42._0_4_ = -(uint)(auVar29._0_4_ < auVar70._0_4_);
                  auVar42._8_4_ = -(uint)(auVar29._8_4_ < auVar70._8_4_);
                  auVar42._12_4_ = -(uint)(auVar29._12_4_ < auVar70._12_4_);
                  uVar13 = movmskps((int)uVar14,auVar42);
                  uVar14 = (ulong)uVar13;
                  if (uVar13 != 0) {
                    *(undefined1 (*) [16])paVar19[-3].v = auVar70;
                    *(undefined1 (*) [16])paVar19[-2].v = auVar29;
                    auVar70 = *(undefined1 (*) [16])(pNVar16 + -3);
                    auVar30._0_8_ = auVar70._8_8_;
                    auVar30._8_4_ = auVar70._0_4_;
                    auVar30._12_4_ = auVar70._4_4_;
                    *(undefined1 (*) [16])(pNVar16 + -3) = auVar30;
                  }
                }
              }
            }
            if (pRVar20 == (RayQueryContext *)&DAT_fffffffffffffff8) {
              return;
            }
            valid_leaf.field_0.i[1] = -(uint)(fVar83 < (float)local_1788._4_4_);
            valid_leaf.field_0.i[0] = -(uint)(fVar78 < (float)local_1788._0_4_);
            valid_leaf.field_0.i[2] = -(uint)(fVar36 < fStack_1780);
            valid_leaf.field_0.i[3] = -(uint)(fVar37 < fStack_177c);
            uVar13 = movmskps((int)uVar14,(undefined1  [16])valid_leaf.field_0);
            uVar14 = (ulong)uVar13;
            if (uVar13 != 0) {
              lVar17 = (ulong)((uint)pRVar20 & 0xf) - 8;
              if (lVar17 != 0) {
                pRVar20 = (RayQueryContext *)((ulong)pRVar20 & 0xfffffffffffffff0);
                do {
                  context = pRVar20;
                  InstanceArrayIntersectorKMB<4>::intersect
                            (&valid_leaf,&pre,(RayHitK<4> *)This,(RayQueryContext *)ray,
                             (Primitive_conflict4 *)pRVar20);
                  pRVar20 = (RayQueryContext *)&pRVar20->user;
                  lVar17 = lVar17 + -1;
                  uVar14 = extraout_RAX;
                  fVar46 = local_1748;
                  fVar48 = fStack_1744;
                  fVar50 = fStack_1740;
                  fVar52 = fStack_173c;
                  fVar71 = local_1738;
                  fVar74 = fStack_1734;
                  fVar92 = fStack_1730;
                  fVar93 = fStack_172c;
                  fVar94 = local_1708;
                  fVar96 = fStack_1704;
                  fVar97 = fStack_1700;
                  fVar98 = fStack_16fc;
                  fVar99 = local_1718;
                  fVar100 = fStack_1714;
                  fVar101 = fStack_1710;
                  fVar102 = fStack_170c;
                  fVar103 = local_1728;
                  fVar104 = fStack_1724;
                  fVar105 = fStack_1720;
                  fVar106 = fStack_171c;
                } while (lVar17 != 0);
              }
              _local_1788 = blendvps(_local_1788,
                                     *(undefined1 (*) [16])&(This->intersector4_nofilter).name,
                                     (undefined1  [16])valid_leaf.field_0);
            }
          }
LAB_00244635:
          pRVar20 = (RayQueryContext *)pNVar16[-1].ptr;
          pNVar16 = pNVar16 + -1;
        } while (pRVar20 != (RayQueryContext *)0xfffffffffffffff8);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }